

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ReadObs(ReadData *this,FILE *file,uchar *HeadBuff)

{
  SATTIME *pSVar1;
  uint uVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint *Message;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  undefined1 *puVar10;
  long lVar11;
  
  iVar5 = 6;
  if ((this->Head).MessageID == 0x2b) {
    lVar6 = (long)(this->Head).MessageLength;
    sVar7 = lVar6 + 4;
    iVar5 = -1;
    if (-5 < lVar6) {
      iVar5 = (int)sVar7;
    }
    Message = (uint *)operator_new__((long)iVar5);
    sVar7 = fread(Message,sVar7,1,(FILE *)file);
    if (sVar7 == 0) {
      iVar5 = 2;
    }
    else {
      uVar2 = *Message;
      bVar4 = CRCCheck(HeadBuff,(uchar *)Message,(this->Head).MessageLength,uVar2 * 0x2c + 4);
      iVar5 = 3;
      if (bVar4) {
        lVar6 = 0;
        do {
          *(undefined8 *)(&this->field_0x1c10 + lVar6) = 0xbff0000000000000;
          *(undefined8 *)((long)(&this->field_0x1c10 + lVar6) + 8) = 0xbff0000000000000;
          lVar6 = lVar6 + 0x70;
        } while (lVar6 != 0xe00);
        lVar6 = 0x10;
        do {
          *(undefined8 *)(&this->field_0x0 + lVar6) = 0xbff0000000000000;
          *(undefined8 *)((long)(&this->field_0x0 + lVar6) + 8) = 0xbff0000000000000;
          lVar6 = lVar6 + 0x70;
        } while (lVar6 != 0x1c10);
        if (0 < (int)uVar2) {
          pSVar1 = &(this->Head).GPST;
          lVar6 = 0;
          do {
            uVar8 = *(uint *)((long)Message + lVar6 + 0x2c);
            uVar9 = uVar8 >> 0x10 & 7;
            if (uVar9 == 0) {
              uVar8 = uVar8 >> 0x15 & 0x1f;
              lVar11 = (ulong)(*(ushort *)((long)Message + lVar6 + 4) - 1 & 0xffff) * 0x70;
              puVar10 = &this->field_0x1c00 + lVar11;
              dVar3 = (this->Head).GPST.SOW;
              *(undefined8 *)(&this->field_0x1c00 + lVar11) = *(undefined8 *)pSVar1;
              *(double *)((long)(&this->field_0x1c00 + lVar11) + 8) = dVar3;
              if (uVar8 != 9) goto LAB_001089b9;
LAB_00108a4d:
              *(undefined8 *)(puVar10 + 0x18) = *(undefined8 *)((long)Message + lVar6 + 8);
              *(undefined4 *)(puVar10 + 0x24) = *(undefined4 *)((long)Message + lVar6 + 0x10);
              *(undefined8 *)(puVar10 + 0x30) = *(undefined8 *)((long)Message + lVar6 + 0x14);
              *(undefined4 *)(puVar10 + 0x3c) = *(undefined4 *)((long)Message + lVar6 + 0x1c);
              *(undefined4 *)(puVar10 + 0x44) = *(undefined4 *)((long)Message + lVar6 + 0x20);
              *(undefined4 *)(puVar10 + 0x4c) = *(undefined4 *)((long)Message + lVar6 + 0x24);
              *(undefined4 *)(puVar10 + 0x54) = *(undefined4 *)((long)Message + lVar6 + 0x28);
            }
            else if (uVar9 == 4) {
              lVar11 = (ulong)(*(ushort *)((long)Message + lVar6 + 4) - 1 & 0xffff) * 0x70;
              puVar10 = &this->field_0x0 + lVar11;
              dVar3 = (this->Head).GPST.SOW;
              *(undefined8 *)(&this->field_0x0 + lVar11) = *(undefined8 *)pSVar1;
              *(double *)((long)(&this->field_0x0 + lVar11) + 8) = dVar3;
              uVar8 = uVar8 & 0x3600000;
              if (uVar8 == 0x400000) goto LAB_00108a4d;
LAB_001089b9:
              if (uVar8 == 0) {
                *(undefined8 *)(puVar10 + 0x10) = *(undefined8 *)((long)Message + lVar6 + 8);
                *(undefined4 *)(puVar10 + 0x20) = *(undefined4 *)((long)Message + lVar6 + 0x10);
                *(undefined8 *)(puVar10 + 0x28) = *(undefined8 *)((long)Message + lVar6 + 0x14);
                *(undefined4 *)(puVar10 + 0x38) = *(undefined4 *)((long)Message + lVar6 + 0x1c);
                *(undefined4 *)(puVar10 + 0x40) = *(undefined4 *)((long)Message + lVar6 + 0x20);
                *(undefined4 *)(puVar10 + 0x48) = *(undefined4 *)((long)Message + lVar6 + 0x24);
                *(undefined4 *)(puVar10 + 0x50) = *(undefined4 *)((long)Message + lVar6 + 0x28);
              }
            }
            lVar6 = lVar6 + 0x2c;
          } while ((ulong)uVar2 * 0x2c - lVar6 != 0);
        }
        operator_delete__(Message);
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int ReadData::ReadObs(FILE* file, unsigned char* HeadBuff)
{
    if(Head.MessageID != 43)
        return CONFLICT_ID;

    char* buff = new char [Head.MessageLength + 4];
    if(!fread(buff, this->Head.MessageLength + 4, 1, file))
        return FILE_OR_BUFF_END;

    int obsNum = U2I((unsigned char*)(buff), 4);
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, obsNum * 44 + 4))
        return CRC_FAILED;
        
    for(int prn = 0; prn < MAXGPSSRN; ++prn){
        this->GPSObs[prn].psr[0] = -1;
        this->GPSObs[prn].psr[1] = -1;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn){
        this->BDSObs[prn].psr[0] = -1;
        this->BDSObs[prn].psr[1] = -1;
    }
    try
    {
        for(int i = 0; i < obsNum; ++i)
        {
            int ChannelState = U2I((unsigned char*)(buff + i * 44 + 44), 4);
            int sys = (ChannelState >> 16) & 7;
            switch(sys)
            {
                case BDS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->BDSObs[PRN].ObsTime = Head.GPST;

                    // B1 signal
                    if(SignalType == 0 || SignalType == 4)
                    {
                        this->BDSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // B3 signal
                    if(SignalType == 2 || SignalType == 6)
                    {
                        this->BDSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->BDSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->BDSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->BDSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->BDSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->BDSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->BDSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                case GPS:
                {
                    int SignalType = (ChannelState >> 21) & 31;
                    unsigned short int PRN = U2I((unsigned char*)(buff + i * 44 + 4), 2) - 1;
                    this->GPSObs[PRN].ObsTime = Head.GPST;
                    // L1 C/A
                    if(SignalType == 0)
                    {
                        this->GPSObs[PRN].psr[0] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[0] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[0] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[0] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[0] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[0] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[0] = C2F(buff + i * 44 + 40, 4);
                    }
                    // L2P
                    if(SignalType == 9)
                    {
                        this->GPSObs[PRN].psr[1] = C2D(buff + i * 44 + 8, 8);
                        this->GPSObs[PRN].psr_sigma[1] = C2F(buff + i * 44 + 16, 4);
                        this->GPSObs[PRN].adr[1] = C2D(buff + i * 44 + 20, 8);
                        this->GPSObs[PRN].adr_sigma[1] = C2F(buff + i * 44 + 28, 4);
                        this->GPSObs[PRN].dopp[1] = C2F(buff + i * 44 + 32, 4);
                        this->GPSObs[PRN].CNo[1] = C2F(buff + i * 44 + 36, 4);
                        this->GPSObs[PRN].LockTime[1] = C2F(buff + i * 44 + 40, 4);
                    }
                    break;
                }
                default: break;
            }
        }
    }
    catch(...)
    {
        cout << "error happened when reading obs" << endl;
        return -1;
    }
    delete[] buff;
    return 0;
    
}